

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCircBufferedStream.cpp
# Opt level: O0

void __thiscall
TPZCircBufferedStream::WriteToBuffer(TPZCircBufferedStream *this,char *source,size_t *nBytes)

{
  ulong uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t *in_RDX;
  void *in_RSI;
  long *in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t nBytesWritten;
  char *endBuffer;
  char *temp;
  size_t newAllocatedBytes;
  size_t oldSize;
  long local_20;
  size_t *local_18;
  void *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((ulong)in_RDI[4] < in_RDI[5] + *in_RDX) {
    local_20 = in_RDI[5];
    auVar5._8_4_ = (int)((ulong)local_20 >> 0x20);
    auVar5._0_8_ = local_20;
    auVar5._12_4_ = 0x45300000;
    sVar3 = *in_RDX;
    auVar6._8_4_ = (int)(sVar3 >> 0x20);
    auVar6._0_8_ = sVar3;
    auVar6._12_4_ = 0x45300000;
    dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0)) * 1.1 +
            (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0) + 1.0;
    uVar1 = (ulong)dVar4;
    uVar1 = uVar1 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f;
    pvVar2 = operator_new__(uVar1);
    (**(code **)(*in_RDI + 0x1d8))(in_RDI,pvVar2,&local_20);
    memcpy((void *)((long)pvVar2 + local_20),local_10,*local_18);
    if ((void *)in_RDI[1] != (void *)0x0) {
      operator_delete__((void *)in_RDI[1]);
    }
    in_RDI[1] = (long)pvVar2;
    in_RDI[4] = uVar1;
    in_RDI[2] = in_RDI[1];
    in_RDI[5] = local_20 + *local_18;
    in_RDI[3] = in_RDI[1] + -1 + in_RDI[5];
  }
  else {
    if (in_RDI[3] + *in_RDX < (ulong)(in_RDI[1] + in_RDI[4])) {
      memcpy((void *)(in_RDI[3] + 1),in_RSI,*in_RDX);
      in_RDI[3] = *local_18 + in_RDI[3];
    }
    else {
      sVar3 = ((in_RDI[1] + in_RDI[4]) - in_RDI[3]) - 1;
      memcpy((void *)(in_RDI[3] + 1),in_RSI,sVar3);
      if (*local_18 != sVar3) {
        memcpy((void *)in_RDI[1],(void *)((long)local_10 + sVar3),*local_18 - sVar3);
      }
      in_RDI[3] = (in_RDI[1] + -1 + *local_18) - sVar3;
    }
    in_RDI[5] = *local_18 + in_RDI[5];
  }
  return;
}

Assistant:

void TPZCircBufferedStream::WriteToBuffer(const char *source,
                                      const size_t &nBytes) {
    if (fSize + nBytes > fNAllocatedBytes) {
        const size_t oldSize = fSize;
        const size_t newAllocatedBytes =
            oldSize * 1.1 + nBytes +
            MIN_SIZE_INCREMENT; // 10% increase + nBytes + MIN_SIZE_INCREMENT
        char *temp = new char[newAllocatedBytes];
        ConstReadFromBuffer(temp, oldSize);
        memcpy(temp + oldSize, source, nBytes);
        delete[] fBuffer;
        fBuffer = temp;
        fNAllocatedBytes = newAllocatedBytes;
        fFirst = fBuffer;
        fSize = oldSize + nBytes;
        fLast = fBuffer - 1 + fSize;
    } else {
        char *endBuffer = fBuffer + fNAllocatedBytes;

        if (fLast + nBytes < endBuffer) {
            // direct writing (we do not need to cycle to the beginning of the
            // buffer to write)
            memcpy(fLast + 1, source, nBytes);
            fLast += nBytes;
        } else {
            // we need to write past the end of the buffer.
            const size_t nBytesWritten(endBuffer - fLast - 1);
            memcpy(fLast + 1, source, nBytesWritten);
            if (nBytes != nBytesWritten) {
                memcpy(fBuffer, source + nBytesWritten, nBytes - nBytesWritten);
            }
            fLast = fBuffer - 1 + nBytes - nBytesWritten;
        }

        fSize += nBytes;
    }
}